

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  d_derived_tbl *pdVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  jpeg_source_mgr *pjVar9;
  int bits_left;
  int iVar10;
  ulong uVar11;
  _func_void_j_decompress_ptr *get_buffer;
  int iVar12;
  uint uVar13;
  j_decompress_ptr pjVar14;
  bitread_working_state br_state;
  savable_state state;
  bitread_working_state local_98;
  long local_70;
  j_decompress_ptr local_68;
  JBLOCKROW local_60;
  undefined8 local_58;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Stack_50;
  undefined4 local_48;
  JBLOCKROW *local_38;
  
  pjVar1 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar1[3].decode_mcu != 0)) ||
     (bVar3 = process_restart(cinfo), bVar3 != 0)) {
    if (*(int *)((long)&pjVar1[3].start_pass + 4) == 0) {
      pjVar9 = cinfo->src;
      local_98.next_input_byte = pjVar9->next_input_byte;
      local_98.bytes_in_buffer = pjVar9->bytes_in_buffer;
      get_buffer = pjVar1[1].start_pass;
      bits_left = *(int *)&pjVar1[1].decode_mcu;
      local_48 = *(undefined4 *)&pjVar1[3].start_pass;
      local_58 = pjVar1[2].start_pass;
      p_Stack_50 = pjVar1[2].decode_mcu;
      if (0 < cinfo->blocks_in_MCU) {
        local_70 = 0;
        local_38 = MCU_data;
        local_98.cinfo = cinfo;
        local_68 = cinfo;
        do {
          local_60 = local_38[local_70];
          pdVar2 = (d_derived_tbl *)(&pjVar1[10].decode_mcu)[local_70];
          if (bits_left < 8) {
            bVar3 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar3 == 0) {
              return 0;
            }
            get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer;
            bits_left = local_98.bits_left;
            if (7 < local_98.bits_left) goto LAB_00280b3a;
            uVar4 = jpeg_huff_decode(&local_98,local_98.get_buffer,local_98.bits_left,pdVar2,1);
            pjVar14 = local_68;
LAB_00280b7a:
            get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer;
            bits_left = local_98.bits_left;
            if ((int)uVar4 < 0) goto LAB_00280e6a;
          }
          else {
LAB_00280b3a:
            pjVar14 = local_68;
            uVar8 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (pdVar2->look_nbits[uVar8] == 0) {
              uVar4 = jpeg_huff_decode(&local_98,(bit_buf_type)get_buffer,bits_left,pdVar2,9);
              goto LAB_00280b7a;
            }
            uVar4 = (uint)pdVar2->look_sym[uVar8];
            bits_left = bits_left - pdVar2->look_nbits[uVar8];
          }
          pdVar2 = (d_derived_tbl *)(&pjVar1[0xf].decode_mcu)[local_70];
          iVar12 = *(int *)((long)&pjVar1[0x14].decode_mcu + local_70 * 4);
          if (iVar12 == 0) {
            iVar6 = 1;
            if (uVar4 != 0) {
              if ((bits_left < (int)uVar4) &&
                 (bVar3 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)get_buffer,bits_left,uVar4),
                 get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer,
                 bits_left = local_98.bits_left, bVar3 == 0)) goto LAB_00280e6a;
              bits_left = bits_left - uVar4;
            }
LAB_00280d87:
            do {
              if (bits_left < 8) {
                bVar3 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)get_buffer,bits_left,0);
                if (bVar3 == 0) {
                  return 0;
                }
                get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer;
                bits_left = local_98.bits_left;
                if (7 < local_98.bits_left) goto LAB_00280dbc;
                iVar12 = 1;
LAB_00280def:
                uVar4 = jpeg_huff_decode(&local_98,(bit_buf_type)get_buffer,bits_left,pdVar2,iVar12)
                ;
                uVar11 = (ulong)uVar4;
                get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer;
                bits_left = local_98.bits_left;
                if ((int)uVar4 < 0) goto LAB_00280e6a;
              }
              else {
LAB_00280dbc:
                uVar8 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
                if (pdVar2->look_nbits[uVar8] == 0) {
                  iVar12 = 9;
                  goto LAB_00280def;
                }
                uVar11 = (ulong)pdVar2->look_sym[uVar8];
                bits_left = bits_left - pdVar2->look_nbits[uVar8];
              }
              iVar12 = (int)(uVar11 >> 4);
              uVar4 = (uint)uVar11 & 0xf;
              if ((uVar11 & 0xf) == 0) {
                if (iVar12 != 0xf) break;
              }
              else {
                if ((bits_left < (int)uVar4) &&
                   (bVar3 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)get_buffer,bits_left,uVar4)
                   , get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer,
                   bits_left = local_98.bits_left, bVar3 == 0)) goto LAB_00280e6a;
                bits_left = bits_left - uVar4;
              }
              iVar6 = iVar6 + iVar12 + 1;
            } while (iVar6 < 0x40);
          }
          else {
            if (uVar4 == 0) {
              iVar6 = 0;
            }
            else {
              if ((bits_left < (int)uVar4) &&
                 (bVar3 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)get_buffer,bits_left,uVar4),
                 get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer,
                 bits_left = local_98.bits_left, bVar3 == 0)) goto LAB_00280e6a;
              bits_left = bits_left - uVar4;
              uVar13 = bmask[uVar4];
              uVar5 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & uVar13;
              if (bmask[uVar4 - 1] < (int)uVar5) {
                uVar13 = 0;
              }
              iVar6 = uVar5 - uVar13;
            }
            iVar6 = iVar6 + *(int *)((long)&local_58 +
                                    (long)pjVar14->MCU_membership[local_70] * 4 + 4);
            *(int *)((long)&local_58 + (long)pjVar14->MCU_membership[local_70] * 4 + 4) = iVar6;
            (*local_60)[0] = (JCOEF)iVar6;
            iVar6 = 1;
            if (iVar12 < 2) goto LAB_00280d87;
            iVar6 = 1;
            do {
              if (bits_left < 8) {
                bVar3 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)get_buffer,bits_left,0);
                if (bVar3 == 0) {
                  return 0;
                }
                get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer;
                bits_left = local_98.bits_left;
                if (7 < local_98.bits_left) goto LAB_00280c9f;
                iVar10 = 1;
LAB_00280cd2:
                uVar4 = jpeg_huff_decode(&local_98,(bit_buf_type)get_buffer,bits_left,pdVar2,iVar10)
                ;
                get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer;
                bits_left = local_98.bits_left;
                if ((int)uVar4 < 0) goto LAB_00280e6a;
              }
              else {
LAB_00280c9f:
                uVar8 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
                if (pdVar2->look_nbits[uVar8] == 0) {
                  iVar10 = 9;
                  goto LAB_00280cd2;
                }
                uVar4 = (uint)pdVar2->look_sym[uVar8];
                bits_left = bits_left - pdVar2->look_nbits[uVar8];
              }
              uVar13 = uVar4 & 0xf;
              if (uVar13 == 0) {
                if (uVar4 >> 4 != 0xf) goto LAB_00280e41;
                iVar10 = iVar6 + 0xf;
              }
              else {
                if ((bits_left < (int)uVar13) &&
                   (bVar3 = jpeg_fill_bit_buffer
                                      (&local_98,(bit_buf_type)get_buffer,bits_left,uVar13),
                   get_buffer = (_func_void_j_decompress_ptr *)local_98.get_buffer,
                   bits_left = local_98.bits_left, bVar3 == 0)) goto LAB_00280e6a;
                bits_left = bits_left - uVar13;
                uVar7 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[uVar13];
                uVar5 = 0;
                if ((int)uVar7 <= bmask[uVar13 - 1]) {
                  uVar5 = bmask[uVar13];
                }
                iVar10 = (uVar4 >> 4) + iVar6;
                (*local_60)[jpeg_natural_order[iVar10]] = (short)uVar7 - (short)uVar5;
              }
              iVar6 = iVar10 + 1;
            } while (iVar6 < iVar12);
            if (iVar10 < 0x3f) goto LAB_00280d87;
          }
LAB_00280e41:
          local_70 = local_70 + 1;
        } while (local_70 < local_68->blocks_in_MCU);
        pjVar9 = local_68->src;
      }
      pjVar9->next_input_byte = local_98.next_input_byte;
      pjVar9->bytes_in_buffer = local_98.bytes_in_buffer;
      pjVar1[1].start_pass = get_buffer;
      *(int *)&pjVar1[1].decode_mcu = bits_left;
      *(undefined4 *)&pjVar1[3].start_pass = local_48;
      pjVar1[2].start_pass = local_58;
      pjVar1[2].decode_mcu = p_Stack_50;
    }
    *(int *)&pjVar1[3].decode_mcu = *(int *)&pjVar1[3].decode_mcu + -1;
    bVar3 = 1;
  }
  else {
LAB_00280e6a:
    bVar3 = 0;
  }
  return bVar3;
}

Assistant:

METHODDEF(boolean)
decode_mcu (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    (*block)[0] = (JCOEF) entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    if (cinfo->lim_Se == 0) continue;
    tbl = compptr->ac_tbl_no;
    k = 0;

    /* Figure F.20: Decode_AC_coefficients */
    do {
      st = entropy->ac_stats[tbl] + 3 * k;
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
      for (;;) {
	k++;
	if (arith_decode(cinfo, st + 1)) break;
	st += 3;
	if (k >= cinfo->lim_Se) {
	  WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	  entropy->ct = -1;			/* spectral overflow */
	  return TRUE;
	}
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	if (arith_decode(cinfo, st)) {
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (arith_decode(cinfo, st)) {
	    if ((m <<= 1) == 0x8000) {
	      WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	      entropy->ct = -1;			/* magnitude overflow */
	      return TRUE;
	    }
	    st += 1;
	  }
	}
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      (*block)[natural_order[k]] = (JCOEF) v;
    } while (k < cinfo->lim_Se);
  }

  return TRUE;
}